

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.hpp
# Opt level: O0

void __thiscall
vk::BinaryRegistryDetail::ProgramNotFoundException::ProgramNotFoundException
          (ProgramNotFoundException *this,ProgramIdentifier *id,string *reason)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *reason_local;
  ProgramIdentifier *id_local;
  ProgramNotFoundException *this_local;
  
  local_20 = reason;
  reason_local = &id->testCasePath;
  id_local = (ProgramIdentifier *)this;
  std::operator+(&local_c0,"Program ",&id->testCasePath);
  std::operator+(&local_a0,&local_c0," / \'");
  std::operator+(&local_80,&local_a0,reason_local + 1);
  std::operator+(&local_60,&local_80,"\' not found: ");
  std::operator+(&local_40,&local_60,local_20);
  tcu::ResourceError::ResourceError(&this->super_ResourceError,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  *(undefined ***)&(this->super_ResourceError).super_TestException.super_Exception =
       &PTR__ProgramNotFoundException_0168adf0;
  return;
}

Assistant:

ProgramNotFoundException (const ProgramIdentifier& id, const std::string& reason)
		: tcu::ResourceError("Program " + id.testCasePath + " / '" + id.programName + "' not found: " + reason)
	{
	}